

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model.c
# Opt level: O1

int32 ngram_class_add_word(ngram_class_t *lmclass,int32 wid,int32 lweight)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  ngram_hash_s *pnVar4;
  ulong uVar5;
  
  if (lmclass->nword_hash == (ngram_hash_s *)0x0) {
    pnVar4 = (ngram_hash_s *)
             __ckd_malloc__(0x600,
                            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                            ,0x2ce);
    lmclass->nword_hash = pnVar4;
    memset(pnVar4,0xff,0x600);
    lmclass->n_hash = 0x80;
    lmclass->n_hash_inuse = 0;
  }
  uVar1 = lmclass->n_hash;
  uVar3 = uVar1 - 1 & wid;
  pnVar4 = lmclass->nword_hash;
  if (pnVar4[(int)uVar3].wid == -1) {
    pnVar4[(int)uVar3].wid = wid;
    pnVar4[(int)uVar3].prob1 = lweight;
  }
  else {
    do {
      uVar2 = uVar3;
      uVar3 = pnVar4[(int)uVar2].next;
    } while (pnVar4[(int)uVar2].next != 0xffffffff);
    if (uVar2 == 0xffffffff) {
      __assert_fail("hash != -1",
                    "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                    ,0x2e4,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
    }
    if (lmclass->n_hash_inuse == uVar1) {
      pnVar4 = (ngram_hash_s *)
               __ckd_realloc__(pnVar4,(long)(int)uVar1 * 0x18,
                               "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                               ,0x2eb);
      lmclass->nword_hash = pnVar4;
      memset(pnVar4 + lmclass->n_hash,0xff,(long)lmclass->n_hash * 0xc);
      uVar3 = lmclass->n_hash;
      lmclass->n_hash = uVar3 * 2;
    }
    else {
      uVar5 = 0;
      if (0 < (int)uVar1) {
        do {
          if (pnVar4->wid == -1) goto LAB_00134404;
          uVar5 = uVar5 + 1;
          pnVar4 = pnVar4 + 1;
        } while (uVar1 != uVar5);
        uVar5 = (ulong)uVar1;
      }
LAB_00134404:
      uVar3 = (uint)uVar5;
      if (uVar3 == uVar1) {
        __assert_fail("next != lmclass->n_hash",
                      "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model.c"
                      ,0x2f8,"int32 ngram_class_add_word(ngram_class_t *, int32, int32)");
      }
    }
    pnVar4 = lmclass->nword_hash;
    pnVar4[(int)uVar3].wid = wid;
    pnVar4[(int)uVar3].prob1 = lweight;
    pnVar4[(int)uVar2].next = uVar3;
  }
  lmclass->n_hash_inuse = lmclass->n_hash_inuse + 1;
  return uVar3;
}

Assistant:

int32
ngram_class_add_word(ngram_class_t * lmclass, int32 wid, int32 lweight)
{
    int32 hash;

    if (lmclass->nword_hash == NULL) {
        /* Initialize everything in it to -1 */
        lmclass->nword_hash =
            ckd_malloc(NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        memset(lmclass->nword_hash, 0xff,
               NGRAM_HASH_SIZE * sizeof(*lmclass->nword_hash));
        lmclass->n_hash = NGRAM_HASH_SIZE;
        lmclass->n_hash_inuse = 0;
    }
    /* Stupidest possible hash function.  This will work pretty well
     * when this function is called repeatedly with contiguous word
     * IDs, though... */
    hash = wid & (lmclass->n_hash - 1);
    if (lmclass->nword_hash[hash].wid == -1) {
        /* Good, no collision. */
        lmclass->nword_hash[hash].wid = wid;
        lmclass->nword_hash[hash].prob1 = lweight;
        ++lmclass->n_hash_inuse;
        return hash;
    }
    else {
        int32 next; /**< Next available bucket. */
        /* Collision... Find the end of the hash chain. */
        while (lmclass->nword_hash[hash].next != -1)
            hash = lmclass->nword_hash[hash].next;
        assert(hash != -1);
        /* Does we has any more bukkit? */
        if (lmclass->n_hash_inuse == lmclass->n_hash) {
            /* Oh noes!  Ok, we makes more. */
            lmclass->nword_hash = ckd_realloc(lmclass->nword_hash,
                                              lmclass->n_hash * 2 *
                                              sizeof(*lmclass->
                                                     nword_hash));
            memset(lmclass->nword_hash + lmclass->n_hash, 0xff,
                   lmclass->n_hash * sizeof(*lmclass->nword_hash));
            /* Just use the next allocated one (easy) */
            next = lmclass->n_hash;
            lmclass->n_hash *= 2;
        }
        else {
            /* Look for any available bucket.  We hope this doesn't happen. */
            for (next = 0; next < lmclass->n_hash; ++next)
                if (lmclass->nword_hash[next].wid == -1)
                    break;
            /* This should absolutely not happen. */
            assert(next != lmclass->n_hash);
        }
        lmclass->nword_hash[next].wid = wid;
        lmclass->nword_hash[next].prob1 = lweight;
        lmclass->nword_hash[hash].next = next;
        ++lmclass->n_hash_inuse;
        return next;
    }
}